

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall gmath::PinholeCamera::getProperties(PinholeCamera *this,Properties *prop,int id)

{
  Distortion *pDVar1;
  Camera *this_00;
  _Alloc_hider this_01;
  string local_40;
  
  this_00 = (Camera *)prop;
  Camera::getProperties(&this->super_Camera,prop,id);
  Camera::getCameraKey_abi_cxx11_(&local_40,this_00,"A",id);
  this_01._M_p = local_40._M_dataplus._M_p;
  gutil::Properties::putValue<gmath::SMatrix<double,3,3>>(prop,local_40._M_dataplus._M_p,&this->A);
  std::__cxx11::string::~string((string *)&local_40);
  Camera::getCameraKey_abi_cxx11_(&local_40,(Camera *)this_01._M_p,"rho",id);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,&this->rho);
  std::__cxx11::string::~string((string *)&local_40);
  pDVar1 = this->dist;
  if (pDVar1 != (Distortion *)0x0) {
    (*pDVar1->_vptr_Distortion[8])(pDVar1,prop,(ulong)(uint)id);
  }
  return;
}

Assistant:

void PinholeCamera::getProperties(gutil::Properties &prop, int id) const
{
  Camera::getProperties(prop, id);

  prop.putValue(getCameraKey("A", id).c_str(), A);
  prop.putValue(getCameraKey("rho", id).c_str(), rho);

  if (dist != 0)
  {
    dist->getProperties(prop, id);
  }
}